

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cpp
# Opt level: O0

void __thiscall Simulator::dumpHistory(Simulator *this)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  long in_RDI;
  uint32_t i;
  ofstream ofile;
  MemoryManager *in_stack_000001f8;
  string local_238 [32];
  uint local_218;
  ostream local_208 [520];
  
  std::ofstream::ofstream(local_208,"dump.txt",_S_out);
  std::operator<<(local_208,"---------Execution History--------\n");
  local_218 = 0;
  while( true ) {
    uVar1 = (ulong)local_218;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x1c8));
    if (sVar2 <= uVar1) break;
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(in_RDI + 0x1c8),(ulong)local_218);
    std::operator<<(local_208,(string *)pvVar3);
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(in_RDI + 0x1e0),(ulong)local_218);
    std::operator<<(local_208,(string *)pvVar3);
    local_218 = local_218 + 1;
  }
  std::operator<<(local_208,"\n---------Memory Dump---------------\n");
  MemoryManager::dumpMemory_abi_cxx11_(in_stack_000001f8);
  std::operator<<(local_208,local_238);
  std::__cxx11::string::~string(local_238);
  std::ostream::operator<<((ostream *)local_208,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void Simulator::dumpHistory() {
    std::ofstream ofile("dump.txt");
    ofile << "---------Execution History--------\n";
    for (uint32_t i = 0; i < this->history.inst_record.size(); i++) {
        ofile << this->history.inst_record[i];
        ofile << this->history.reg_record[i];
    }
    ofile << "\n---------Memory Dump---------------\n";
    ofile << memory->dumpMemory();
    ofile << std::endl;

    ofile.close();
}